

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

bean_ptr<A> * __thiscall
hiberlite::Database::manageBean<A>(bean_ptr<A> *__return_storage_ptr__,Database *this,A *ptr)

{
  sqlid_t sVar1;
  shared_res<hiberlite::autoclosed_con> local_98;
  bean_key local_88;
  bean_key local_70;
  bean_key local_58;
  string local_40;
  
  getClassName<A>();
  sVar1 = allocId(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_98._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_98.res = (this->con).res;
  if (local_98.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_98.res)->refCount = (local_98.res)->refCount + 2;
  }
  local_58.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_58.id = sVar1;
  local_58.con.res = local_98.res;
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_98);
  bean_key::bean_key(&local_70,&local_58);
  dbUpdate<A>(&local_70,ptr);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_70.con);
  bean_key::bean_key(&local_88,&local_58);
  Registry<A>::createBeanPtr(__return_storage_ptr__,&local_88,ptr);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_88.con);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_58.con);
  return __return_storage_ptr__;
}

Assistant:

inline bean_ptr<C> Database::manageBean(C* ptr)
{
	sqlid_t id=allocId( Database::getClassName<C>() );
	bean_key key(con,id);
	dbUpdate(key,*ptr);
	return Registry<C>::createBeanPtr(key,ptr);
}